

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator.cc
# Opt level: O2

fdb_status
fdb_iterator_init(fdb_kvs_handle *handle,fdb_iterator **ptr_iterator,void *start_key,
                 size_t start_keylen,void *end_key,size_t end_keylen,fdb_iterator_opt_t opt)

{
  uint32_t *puVar1;
  ushort uVar2;
  kvs_info *pkVar3;
  fdb_kvs_id_t fVar4;
  hbtrie *trie;
  filemgr *file;
  snap_handle *shandle;
  wal_iterator *pwVar5;
  undefined8 uVar6;
  long lVar7;
  fdb_status fVar8;
  hbtrie_result hVar9;
  ulong uVar10;
  fdb_iterator *iterator;
  char *pcVar11;
  void *pvVar12;
  size_t sVar13;
  hbtrie_iterator *it;
  wal_item *pwVar14;
  undefined8 *puVar15;
  undefined1 *puVar16;
  fdb_kvs_handle *pfVar17;
  size_t chunksize;
  bool bVar18;
  undefined8 uStack_120;
  undefined1 local_118 [8];
  wal_item query;
  wal_item_header query_key;
  
  puVar16 = local_118;
  if (handle == (fdb_kvs_handle *)0x0) {
    puVar15 = &uStack_120;
    uStack_120 = 0xffffffffffffffe2;
  }
  else {
    if (0xff80 < start_keylen) {
      return FDB_RESULT_INVALID_ARGS;
    }
    if ((handle->kvs_config).custom_cmp == (fdb_custom_cmp_variable)0x0) {
      if (0xff80 < end_keylen) {
        return FDB_RESULT_INVALID_ARGS;
      }
    }
    else {
      uVar10 = (ulong)((handle->config).blocksize - 0x100);
      if (uVar10 < start_keylen) {
        return FDB_RESULT_INVALID_ARGS;
      }
      if (0xff80 < end_keylen || uVar10 < end_keylen) {
        return FDB_RESULT_INVALID_ARGS;
      }
    }
    if (((opt & 4) != 0) && (start_keylen == 0 || start_key == (void *)0x0)) {
      return FDB_RESULT_INVALID_ARGS;
    }
    if (((opt & 8) != 0) && (end_keylen == 0 || end_key == (void *)0x0)) {
      return FDB_RESULT_INVALID_ARGS;
    }
    if (handle->shandle == (snap_handle *)0x0) {
      uStack_120 = 0x129590;
      fdb_check_file_reopen(handle,(file_status_t *)0x0);
      uStack_120 = 0x129598;
      fdb_sync_db_header(handle);
      bVar18 = handle->shandle == (snap_handle *)0x0;
    }
    else {
      bVar18 = false;
    }
    uStack_120 = 0x1295b1;
    iterator = (fdb_iterator *)calloc(1,0x98);
    if (bVar18) {
      uStack_120 = 0x1295c7;
      fVar8 = fdb_snapshot_open(handle,(fdb_kvs_handle **)iterator,0xffffffffffffffff);
      if (fVar8 != FDB_RESULT_SUCCESS) {
        uStack_120 = 0x1295e1;
        pcVar11 = _fdb_kvs_get_name(handle,handle->file);
        fdb_log_impl(&handle->log_callback,2,fVar8,
                     "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/iterator.cc"
                     ,"fdb_iterator_init",0x97,
                     "Failed to create an iterator instance due to the failure of open operation on the KV Store \'%s\' in a database file \'%s\'"
                     ,pcVar11,handle->file->filename);
        return fVar8;
      }
      iterator->snapshot_handle = false;
      pfVar17 = iterator->handle;
    }
    else {
      iterator->handle = handle;
      iterator->snapshot_handle = true;
      pfVar17 = handle;
    }
    iterator->opt = opt;
    uStack_120 = 0x12964c;
    pvVar12 = malloc(0xfff0);
    iterator->_key = pvVar12;
    uStack_120 = 0x12965f;
    memset(pvVar12,0,(ulong)(pfVar17->config).chunksize);
    iterator->_keylen = 0;
    iterator->_offset = 0xffffffffffffffff;
    iterator->seqtrie_iterator = (hbtrie_iterator *)0x0;
    iterator->hbtrie_iterator = (hbtrie_iterator *)0x0;
    iterator->seqtree_iterator = (btree_iterator *)0x0;
    pkVar3 = pfVar17->kvs;
    if (pkVar3 == (kvs_info *)0x0) {
      if (start_key == (void *)0x0) {
        pvVar12 = (void *)0x0;
        sVar13 = 0;
      }
      else {
        uStack_120 = 0x1296f6;
        pvVar12 = malloc(start_keylen);
        uStack_120 = 0x129707;
        memcpy(pvVar12,start_key,start_keylen);
        sVar13 = start_keylen;
      }
      iterator->start_key = pvVar12;
      (iterator->field_10).start_keylen = sVar13;
      if (end_key == (void *)0x0) {
        pvVar12 = (void *)0x0;
        end_keylen = 0;
      }
      else {
        uStack_120 = 0x12981f;
        pvVar12 = malloc(end_keylen);
        uStack_120 = 0x129830;
        memcpy(pvVar12,end_key,end_keylen);
      }
      iterator->end_key = pvVar12;
      (iterator->field_12).end_keylen = end_keylen;
    }
    else {
      uVar2 = (handle->config).chunksize;
      chunksize = (size_t)uVar2;
      if (start_key == (void *)0x0) {
        lVar7 = -(ulong)(uVar2 + 0xf & 0xfffffff0);
        start_key = local_118 + lVar7;
        fVar4 = pkVar3->id;
        *(undefined8 *)(local_118 + lVar7 + -8) = 0x12972e;
        kvid2buf(chunksize,fVar4,start_key);
        start_keylen = chunksize;
      }
      else {
        lVar7 = -(chunksize + start_keylen + 0xf & 0xfffffffffffffff0);
        puVar16 = local_118 + lVar7;
        fVar4 = pkVar3->id;
        *(undefined8 *)(local_118 + lVar7 + -8) = 0x1296cb;
        kvid2buf(chunksize,fVar4,puVar16);
        *(undefined8 *)(local_118 + lVar7 + -8) = 0x1296db;
        memcpy(puVar16 + chunksize,start_key,start_keylen);
        start_keylen = chunksize + start_keylen;
        start_key = puVar16;
      }
      if (end_key == (void *)0x0) {
        puVar16 = (undefined1 *)((long)start_key + -(ulong)(uVar2 + 0xf & 0xfffffff0));
        fVar4 = iterator->handle->kvs->id;
        *(undefined8 *)(puVar16 + -8) = 0x1297b6;
        kvid2buf(chunksize,fVar4 + 1,puVar16);
      }
      else {
        puVar16 = (undefined1 *)
                  ((long)start_key + -(chunksize + end_keylen + 0xf & 0xfffffffffffffff0));
        fVar4 = iterator->handle->kvs->id;
        *(undefined8 *)(puVar16 + -8) = 0x129771;
        kvid2buf(chunksize,fVar4,puVar16);
        *(undefined8 *)(puVar16 + -8) = 0x129783;
        memcpy(puVar16 + chunksize,end_key,end_keylen);
        chunksize = chunksize + end_keylen;
      }
      *(undefined8 *)(puVar16 + -8) = 0x1297be;
      pvVar12 = malloc(start_keylen);
      iterator->start_key = pvVar12;
      *(undefined8 *)(puVar16 + -8) = 0x1297d4;
      memcpy(pvVar12,start_key,start_keylen);
      (iterator->field_10).start_keylen = start_keylen;
      *(undefined8 *)(puVar16 + -8) = 0x1297e0;
      pvVar12 = malloc(chunksize);
      iterator->end_key = pvVar12;
      *(undefined8 *)(puVar16 + -8) = 0x1297f2;
      memcpy(pvVar12,puVar16,chunksize);
      (iterator->field_12).end_seqnum = chunksize;
      pfVar17 = iterator->handle;
    }
    *(undefined8 *)(puVar16 + -8) = 0x129855;
    it = (hbtrie_iterator *)malloc(0x98);
    iterator->hbtrie_iterator = it;
    trie = pfVar17->trie;
    *(undefined8 *)(puVar16 + -8) = 0x12986e;
    hVar9 = hbtrie_iterator_init(trie,it,start_key,start_keylen);
    if (hVar9 != HBTRIE_RESULT_SUCCESS) {
      *(code **)(puVar16 + -8) = fdb_iterator_next;
      __assert_fail("hr == HBTRIE_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/iterator.cc"
                    ,0xf0,
                    "fdb_status fdb_iterator_init(fdb_kvs_handle *, fdb_iterator **, const void *, size_t, const void *, size_t, fdb_iterator_opt_t)"
                   );
    }
    file = iterator->handle->file;
    shandle = iterator->handle->shandle;
    *(undefined8 *)(puVar16 + -8) = 1;
    uVar6 = *(undefined8 *)(puVar16 + -8);
    *(undefined8 *)(puVar16 + -8) = 0x129896;
    wal_itr_init(file,shandle,SUB81(uVar6,0),&iterator->wal_itr);
    if ((undefined1 *)start_key == (undefined1 *)0x0) {
      pwVar5 = iterator->wal_itr;
      *(undefined8 *)(puVar16 + -8) = 0x1298d1;
      pwVar14 = wal_itr_first(pwVar5);
    }
    else {
      query.avl_seq.right = (avl_node *)((long)&query.field_12 + 0x10);
      pwVar5 = iterator->wal_itr;
      *(undefined8 *)(puVar16 + -8) = 0x1298c7;
      pwVar14 = wal_itr_search_greater(pwVar5,(wal_item *)local_118);
    }
    iterator->tree_cursor = pwVar14;
    if (pwVar14 != (wal_item *)0x0) {
      iterator->tree_cursor_start = pwVar14;
    }
    iterator->tree_cursor_prev = pwVar14;
    iterator->direction = '\0';
    iterator->status = '\0';
    iterator->_dhandle = (docio_handle *)0x0;
    *ptr_iterator = iterator;
    puVar1 = &iterator->handle->num_iterators;
    *puVar1 = *puVar1 + 1;
    *(undefined8 *)(puVar16 + -8) = 0x129908;
    fVar8 = fdb_iterator_next(iterator);
    if (fVar8 != FDB_RESULT_FILE_CORRUPTION) {
      return FDB_RESULT_SUCCESS;
    }
    *(undefined8 *)(puVar16 + -8) = 0x12991c;
    fdb_iterator_close(iterator);
    puVar15 = (undefined8 *)(puVar16 + -8);
    *(undefined8 *)(puVar16 + -8) = 0xfffffffffffffff0;
  }
  return (fdb_status)*puVar15;
}

Assistant:

LIBFDB_API
fdb_status fdb_iterator_init(fdb_kvs_handle *handle,
                             fdb_iterator **ptr_iterator,
                             const void *start_key,
                             size_t start_keylen,
                             const void *end_key,
                             size_t end_keylen,
                             fdb_iterator_opt_t opt)
{
    if (!handle) {
        return FDB_RESULT_INVALID_HANDLE;
    }

    if (start_keylen > FDB_MAX_KEYLEN ||
        (handle->kvs_config.custom_cmp &&
           (start_keylen > handle->config.blocksize - HBTRIE_HEADROOM ||
            end_keylen > handle->config.blocksize - HBTRIE_HEADROOM)) ||
        end_keylen > FDB_MAX_KEYLEN) {
        return FDB_RESULT_INVALID_ARGS;
    }

    if ((opt & FDB_ITR_SKIP_MIN_KEY && (!start_key || !start_keylen)) ||
        (opt & FDB_ITR_SKIP_MAX_KEY && (!end_key || !end_keylen))) {
        return FDB_RESULT_INVALID_ARGS;
    }

    hbtrie_result hr;
    fdb_status fs;
    LATENCY_STAT_START();

    if (!handle->shandle) {
        // If compaction is already done before this line,
        // handle->file needs to be replaced with handle->new_file.
        fdb_check_file_reopen(handle, NULL);
        fdb_sync_db_header(handle);
    }

    fdb_iterator *iterator = (fdb_iterator *)calloc(1, sizeof(fdb_iterator));

    if (!handle->shandle) {
        // snapshot handle doesn't exist
        // open a new handle to make the iterator handle as a snapshot
        fs = fdb_snapshot_open(handle, &iterator->handle, FDB_SNAPSHOT_INMEM);
        if (fs != FDB_RESULT_SUCCESS) {
            fdb_log(&handle->log_callback, FDB_LOG_ERROR, fs,
                    "Failed to create an iterator instance due to the failure of "
                    "open operation on the KV Store '%s' in a database file '%s'",
                    _fdb_kvs_get_name(handle, handle->file),
                    handle->file->filename);
            return fs;
        }
        iterator->snapshot_handle = false;
    } else {
        // Snapshot handle exists
        // We don't need to open a new handle.. just point to the snapshot handle.
        iterator->handle = handle;
        iterator->snapshot_handle = true;
    }
    iterator->opt = opt;

    iterator->_key = (void*)malloc(FDB_MAX_KEYLEN_INTERNAL);
    // set to zero the first <chunksize> bytes
    memset(iterator->_key, 0x0, iterator->handle->config.chunksize);
    iterator->_keylen = 0;
    iterator->_offset = BLK_NOT_FOUND;
    iterator->hbtrie_iterator = NULL;
    iterator->seqtree_iterator = NULL;
    iterator->seqtrie_iterator = NULL;

    if (iterator->handle->kvs) {
        // multi KV instance mode .. prepend KV ID
        size_t size_chunk = handle->config.chunksize;
        uint8_t *start_key_temp, *end_key_temp;

        if (start_key == NULL) {
            start_key_temp = alca(uint8_t, size_chunk);
            kvid2buf(size_chunk, iterator->handle->kvs->id, start_key_temp);
            start_key = start_key_temp;
            start_keylen = size_chunk;
        } else {
            start_key_temp = alca(uint8_t, size_chunk + start_keylen);
            kvid2buf(size_chunk, iterator->handle->kvs->id, start_key_temp);
            memcpy(start_key_temp + size_chunk, start_key, start_keylen);
            start_key = start_key_temp;
            start_keylen += size_chunk;
        }

        if (end_key == NULL) {
            // set end_key as NULL key of the next KV ID.
            // NULL key doesn't actually exist so that the iterator ends
            // at the last key of the current KV ID.
            end_key_temp = alca(uint8_t, size_chunk);
            kvid2buf(size_chunk, iterator->handle->kvs->id+1, end_key_temp);
            end_key = end_key_temp;
            end_keylen = size_chunk;
        } else {
            end_key_temp = alca(uint8_t, size_chunk + end_keylen);
            kvid2buf(size_chunk, iterator->handle->kvs->id, end_key_temp);
            memcpy(end_key_temp + size_chunk, end_key, end_keylen);
            end_key = end_key_temp;
            end_keylen += size_chunk;
        }

        iterator->start_key = (void*)malloc(start_keylen);
        memcpy(iterator->start_key, start_key, start_keylen);
        iterator->start_keylen = start_keylen;

        iterator->end_key = (void*)malloc(end_keylen);
        memcpy(iterator->end_key, end_key, end_keylen);
        iterator->end_keylen = end_keylen;

    } else { // single KV instance mode
        if (start_key == NULL) {
            iterator->start_key = NULL;
            iterator->start_keylen = 0;
        } else {
            iterator->start_key = (void*)malloc(start_keylen);
            memcpy(iterator->start_key, start_key, start_keylen);
            iterator->start_keylen = start_keylen;
        }

        if (end_key == NULL) {
            iterator->end_key = NULL;
            end_keylen = 0;
        }else{
            iterator->end_key = (void*)malloc(end_keylen);
            memcpy(iterator->end_key, end_key, end_keylen);
        }
        iterator->end_keylen = end_keylen;
    }

    // create an iterator handle for hb-trie
    iterator->hbtrie_iterator = (struct hbtrie_iterator *)
                                malloc(sizeof(struct hbtrie_iterator));
    hr = hbtrie_iterator_init(iterator->handle->trie,
                              iterator->hbtrie_iterator,
                              (void *)start_key, start_keylen);
    assert(hr == HBTRIE_RESULT_SUCCESS);

    wal_itr_init(iterator->handle->file, iterator->handle->shandle, true,
                 &iterator->wal_itr);

    if (start_key) {
        struct wal_item query;
        struct wal_item_header query_key;
        query.header = &query_key;
        query_key.key = iterator->start_key;
        query_key.keylen = iterator->start_keylen;
        iterator->tree_cursor = wal_itr_search_greater(iterator->wal_itr,
                                                       &query);
    } else {
        iterator->tree_cursor = wal_itr_first(iterator->wal_itr);
    }
    // to know reverse iteration endpoint store the start cursor
    if (iterator->tree_cursor) {
        iterator->tree_cursor_start = iterator->tree_cursor;
    }
    iterator->tree_cursor_prev = iterator->tree_cursor;
    iterator->direction = FDB_ITR_DIR_NONE;
    iterator->status = FDB_ITR_IDX;
    iterator->_dhandle = NULL; // populated at the first iterator movement

    *ptr_iterator = iterator;

    ++iterator->handle->num_iterators; // Increment the iterator counter of the KV handle
    fs = fdb_iterator_next(iterator); // position cursor at first key
    LATENCY_STAT_END(iterator->handle->file, FDB_LATENCY_ITR_INIT);
    if (fs == FDB_RESULT_FILE_CORRUPTION) {
        fdb_iterator_close(iterator);
        return fs;
    }

    return FDB_RESULT_SUCCESS;
}